

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskUniqueSetCase::postTest
          (SampleMaskUniqueSetCase *this)

{
  int width;
  int height;
  pointer pSVar1;
  TestLog *log;
  byte bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  uint uVar6;
  _Rb_tree_node_base *p_Var7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  Vector<int,_4> res;
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> sampleCoverage;
  deUint32 mask;
  ScopedLogSection section;
  int local_25c;
  int local_258;
  undefined1 local_230 [32];
  _Rb_tree_node_base *local_210;
  size_t local_208;
  ulong local_200;
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> local_1f8;
  ChannelOrder local_1dc;
  ScopedLogSection local_1d8;
  long local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pSVar1 = (this->m_iterationSampleBuffers).
           super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
           super__Vector_impl_data._M_start;
  width = pSVar1->m_width;
  height = pSVar1->m_height;
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::vector
            (&local_1f8,
             (long)(this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                   super_MultisampleRenderCase.m_numTargetSamples,(allocator_type *)local_1b0);
  log = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
         super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b0 = (undefined1  [8])((long)local_1a8 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Verify","");
  local_230._0_8_ = (long)local_230 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"Verify masks","");
  tcu::ScopedLogSection::ScopedLogSection(&local_1d8,log,(string *)local_1b0,(string *)local_230);
  if (local_230._0_8_ != (long)local_230 + 0x10) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
  }
  if (local_1b0 != (undefined1  [8])((long)local_1a8 + 8)) {
    operator_delete((void *)local_1b0,local_1a8._8_8_ + 1);
  }
  if (0 < (int)((ulong)((long)local_1f8.
                              super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1f8.
                             super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
    uVar12 = 0;
    do {
      local_1b0._0_4_ = R;
      local_1b0._4_4_ = UNSIGNED_INT32;
      tcu::TextureLevel::setStorage
                (local_1f8.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar12,(TextureFormat *)local_1b0,width
                 ,height,1);
      uVar11 = uVar12;
      if (0 < height) {
        iVar14 = 0;
        local_200 = uVar12;
        do {
          if (0 < width) {
            iVar16 = 0;
            do {
              pSVar1 = (this->m_iterationSampleBuffers).
                       super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar8 = *(uint *)((long)pSVar1[uVar12].m_pixels.m_ptr +
                               (long)(pSVar1[uVar12].m_width * iVar14 + iVar16) * 4);
              iVar9 = (int)((ulong)((long)local_1f8.
                                          super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_1f8.
                                         super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x33333333 + (int)uVar11;
              uVar6 = *(uint *)((long)pSVar1[iVar9].m_pixels.m_ptr +
                               (long)(pSVar1[iVar9].m_width * iVar14 + iVar16) * 4);
              tcu::TextureLevel::getAccess
                        ((PixelBufferAccess *)local_1b0,
                         local_1f8.
                         super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar12);
              fVar17 = floorf(((float)(uVar6 >> 0x10 & 0xff) / 255.0) * 31.0 + 0.5);
              fVar18 = floorf(((float)(uVar6 >> 8 & 0xff) / 255.0) * 63.0 + 0.5);
              fVar19 = floorf(((float)(uVar6 & 0xff) / 255.0) * 31.0 + 0.5);
              fVar20 = floorf(((float)(uVar8 >> 8 & 0xff) / 255.0) * 63.0 + 0.5);
              fVar21 = floorf(((float)(uVar8 & 0xff) / 255.0) * 31.0 + 0.5);
              fVar22 = floorf(((float)(uVar8 >> 0x10 & 0xff) / 255.0) * 31.0 + 0.5);
              local_230._0_4_ =
                   ((int)fVar22 << 0xb | (int)fVar21 | (int)fVar20 << 5) & 0xffff |
                   (int)fVar19 << 0x10 | (int)fVar18 << 0x15 | (int)fVar17 << 0x1b;
              local_230._4_4_ = SNORM_INT8;
              local_230._8_4_ = _S_red;
              local_230._12_4_ = 0;
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)local_1b0,(IVec4 *)local_230,iVar16,iVar14,0);
              iVar16 = iVar16 + 1;
              uVar11 = local_200;
            } while (width != iVar16);
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 != height);
      }
      uVar12 = uVar11 + 1;
    } while ((long)uVar12 <
             (long)((int)((ulong)((long)local_1f8.
                                        super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_1f8.
                                       super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                   -0x33333333));
  }
  if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
      m_numRequestedSamples == 0) {
    local_1b0 = (undefined1  [8])
                ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                 super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)
                ->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Verifying sample mask is 0x00000001.",0x24);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (height < 1) {
      bVar5 = true;
      iVar14 = 0;
    }
    else {
      iVar14 = 0;
      bVar5 = true;
      iVar16 = 0;
      do {
        if (0 < width) {
          iVar9 = 0;
          do {
            tcu::TextureLevel::getAccess
                      ((PixelBufferAccess *)local_1b0,
                       local_1f8.
                       super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                       _M_impl.super__Vector_impl_data._M_start);
            tcu::ConstPixelBufferAccess::getPixelInt
                      ((ConstPixelBufferAccess *)local_230,(int)(MessageBuilder *)local_1b0,iVar9,
                       iVar16);
            uVar3 = local_230._0_4_;
            if (local_230._0_4_ != A) {
              iVar14 = iVar14 + 1;
              if (iVar14 < 6) {
                local_1b0 = (undefined1  [8])
                            ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                             super_MultisampleRenderCase.super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Pixel (",7)
                ;
                std::ostream::operator<<((ostringstream *)local_1a8,iVar9);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                std::ostream::operator<<((ostringstream *)local_1a8,iVar16);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"): Invalid mask, got ",0x15);
                local_230._4_4_ = SNORM_INT8;
                local_230._0_4_ = uVar3;
                tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_230,(ostream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,", expected ",0xb);
                local_230._0_4_ = A;
                local_230._4_4_ = SNORM_INT8;
                tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_230,(ostream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
              }
              bVar5 = false;
            }
            iVar9 = iVar9 + 1;
          } while (width != iVar9);
        }
        iVar16 = iVar16 + 1;
      } while (iVar16 != height);
    }
    if ((!bVar5) && (5 < iVar14)) {
      local_1b0 = (undefined1  [8])
                  ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                   super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                  m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"...\n",4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Omitted ",8);
      std::ostream::operator<<((ostringstream *)local_1a8,iVar14 + -5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," error descriptions.",0x14);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  else {
    local_1b0 = (undefined1  [8])
                ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                 super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)
                ->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Verifying invocation sample masks do not share bits.",0x34);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (height < 1) {
      iVar14 = 0;
      bVar10 = true;
    }
    else {
      bVar10 = true;
      iVar14 = 0;
      local_25c = 0;
      do {
        if (0 < width) {
          local_258 = 0;
          do {
            if (0 < (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                    super_MultisampleRenderCase.m_numTargetSamples) {
              lVar13 = 2;
              lVar15 = 0x28;
              bVar2 = 0;
              uVar12 = 0;
              do {
                local_200 = uVar12 + 1;
                local_1d0 = lVar15;
                local_1c8 = lVar13;
                if ((long)local_200 <
                    (long)(this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.m_numTargetSamples) {
                  bVar5 = (bool)(4 < iVar14 & bVar2);
                  while (!bVar5) {
                    tcu::TextureLevel::getAccess
                              ((PixelBufferAccess *)local_1b0,
                               local_1f8.
                               super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar12);
                    iVar16 = (int)(PixelBufferAccess *)local_1b0;
                    tcu::ConstPixelBufferAccess::getPixelInt
                              ((ConstPixelBufferAccess *)local_230,iVar16,local_258,local_25c);
                    uVar3 = local_230._0_4_;
                    tcu::TextureLevel::getAccess
                              ((PixelBufferAccess *)local_1b0,
                               (TextureLevel *)
                               ((long)((local_1f8.
                                        super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                               lVar15 + -8));
                    tcu::ConstPixelBufferAccess::getPixelInt
                              ((ConstPixelBufferAccess *)local_230,iVar16,local_258,local_25c);
                    uVar4 = local_230._0_4_;
                    if ((local_230._0_4_ & uVar3) != R && uVar3 != local_230._0_4_) {
                      iVar14 = iVar14 + 1;
                      bVar2 = 1;
                      if (iVar14 < 6) {
                        local_1b0 = (undefined1  [8])
                                    ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                                     super_MultisampleRenderCase.super_TestCase.super_TestCase.
                                     super_TestNode.m_testCtx)->m_log;
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"Pixel (",7);
                        std::ostream::operator<<((ostringstream *)local_1a8,local_258);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,", ",2);
                        std::ostream::operator<<((ostringstream *)local_1a8,local_25c);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"):\n",3);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"\tSamples ",9);
                        std::ostream::operator<<((ostringstream *)local_1a8,(int)uVar12);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8," and ",5);
                        std::ostream::operator<<((ostringstream *)local_1a8,(int)lVar13 + -1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8," share mask bits\n",0x11);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"\tMask",5);
                        std::ostream::operator<<((ostringstream *)local_1a8,(int)uVar12);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8," = ",3);
                        local_230._4_4_ = SNORM_INT8;
                        local_230._0_4_ = uVar3;
                        tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_230,(ostream *)local_1a8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"\tMask",5);
                        std::ostream::operator<<((ostringstream *)local_1a8,(int)lVar13 + -1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8," = ",3);
                        local_230._4_4_ = SNORM_INT8;
                        local_230._0_4_ = uVar4;
                        tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_230,(ostream *)local_1a8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"\n",1);
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1b0,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                        std::ios_base::~ios_base(local_138);
                        bVar10 = false;
                      }
                      else {
                        bVar10 = false;
                      }
                    }
                    if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.m_numTargetSamples <= lVar13) break;
                    lVar13 = lVar13 + 1;
                    lVar15 = lVar15 + 0x28;
                    bVar5 = (bool)(4 < iVar14 & bVar2);
                  }
                }
                if ((long)(this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.m_numTargetSamples <= (long)local_200) break;
                lVar13 = local_1c8 + 1;
                lVar15 = local_1d0 + 0x28;
                uVar12 = local_200;
              } while (!(bool)(4 < iVar14 & bVar2));
            }
            local_258 = local_258 + 1;
          } while (local_258 != width);
        }
        local_25c = local_25c + 1;
      } while (local_25c != height);
    }
    bVar5 = true;
    if (!bVar10) {
      if (5 < iVar14) {
        local_1b0 = (undefined1  [8])
                    ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                     super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                    m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"...\n",4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Omitted ",8);
        std::ostream::operator<<((ostringstream *)local_1a8,iVar14 + -5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," error descriptions.",0x14);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      bVar5 = false;
    }
    iVar14 = (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
             super_MultisampleRenderCase.m_numTargetSamples;
    uVar6 = (iVar14 - (iVar14 + 1 >> 0x1f)) + 1 >> 1;
    uVar8 = 1;
    if (1 < (int)uVar6) {
      uVar8 = uVar6;
    }
    local_1b0 = (undefined1  [8])
                ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                 super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)
                ->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Verifying cardinality of separate sample mask bit sets. Expecting equal to the number of invocations, (greater or equal to "
               ,0x7b);
    local_200 = (ulong)uVar8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (height < 1) {
      local_25c = 0;
      bVar10 = true;
    }
    else {
      bVar10 = true;
      local_25c = 0;
      iVar14 = 0;
      do {
        if (0 < width) {
          iVar16 = 0;
          do {
            local_230._8_4_ = _S_red;
            local_230._16_8_ = 0;
            local_230._24_8_ = local_230 + 8;
            local_208 = 0;
            local_210 = (_Rb_tree_node_base *)local_230._24_8_;
            if (0 < (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                    super_MultisampleRenderCase.m_numTargetSamples) {
              lVar13 = 0;
              lVar15 = 0;
              do {
                tcu::TextureLevel::getAccess
                          ((PixelBufferAccess *)local_1b0,
                           (TextureLevel *)
                           ((long)((local_1f8.
                                    super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                           lVar13 + -8));
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_1c0,(int)(MessageBuilder *)local_1b0,
                           iVar16,iVar14);
                local_1dc = local_1c0._0_4_;
                std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_insert_unique<unsigned_int_const&>
                          ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)local_230,&local_1dc);
                lVar15 = lVar15 + 1;
                lVar13 = lVar13 + 0x28;
              } while (lVar15 < (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                                super_MultisampleRenderCase.m_numTargetSamples);
            }
            if ((int)local_208 < (int)uVar8) {
              local_25c = local_25c + 1;
              if (local_25c < 6) {
                local_1b0 = (undefined1  [8])
                            ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                             super_MultisampleRenderCase.super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Pixel (",7)
                ;
                std::ostream::operator<<((ostringstream *)local_1a8,iVar16);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                std::ostream::operator<<((ostringstream *)local_1a8,iVar14);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"): Pixel invocations had only ",0x1e);
                std::ostream::operator<<((ostringstream *)local_1a8,(int)local_208);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8," separate mask sets. Expected ",0x1e);
                std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8," or more. Found masks:",0x16);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
                p_Var7 = (_Rb_tree_node_base *)local_230._24_8_;
                if ((_Rb_tree_node_base *)local_230._24_8_ != (_Rb_tree_node_base *)(local_230 + 8))
                {
                  do {
                    local_1b0 = (undefined1  [8])
                                ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                                 super_MultisampleRenderCase.super_TestCase.super_TestCase.
                                 super_TestNode.m_testCtx)->m_log;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"\tMask: ",7);
                    local_1c0._4_4_ = SNORM_INT8;
                    local_1c0._0_4_ = p_Var7[1]._M_color;
                    tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_1c0,(ostream *)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                    std::ios_base::~ios_base(local_138);
                    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
                  } while (p_Var7 != (_Rb_tree_node_base *)(local_230 + 8));
                }
                bVar10 = false;
              }
              else {
                bVar10 = false;
              }
            }
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)local_230);
            iVar16 = iVar16 + 1;
          } while (iVar16 != width);
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 != height);
    }
    if (!bVar10) {
      if (5 < local_25c) {
        local_1b0 = (undefined1  [8])
                    ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                     super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                    m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"...\n",4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Omitted ",8);
        std::ostream::operator<<((ostringstream *)local_1a8,local_25c + -5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," error descriptions.",0x14);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      bVar5 = false;
    }
  }
  if (!bVar5) {
    tcu::TestContext::setTestResult
              ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
               super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Image verification failed");
  }
  tcu::TestLog::endSection(local_1d8.m_log);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::~vector(&local_1f8);
  return;
}

Assistant:

void SampleMaskUniqueSetCase::postTest (void)
{
	DE_ASSERT((m_iterationSampleBuffers.size() % 2) == 0);
	DE_ASSERT((int)m_iterationSampleBuffers.size() / 2 == m_numTargetSamples);

	const int						width			= m_iterationSampleBuffers[0].getWidth();
	const int						height			= m_iterationSampleBuffers[0].getHeight();
	bool							allOk			= true;
	std::vector<tcu::TextureLevel>	sampleCoverage	(m_numTargetSamples);
	const tcu::ScopedLogSection		section			(m_testCtx.getLog(), "Verify", "Verify masks");

	// convert color layers to 32 bit coverage masks, 2 passes per coverage

	for (int sampleNdx = 0; sampleNdx < (int)sampleCoverage.size(); ++sampleNdx)
	{
		sampleCoverage[sampleNdx].setStorage(tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT32), width, height);

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			const tcu::RGBA		lowColor	= m_iterationSampleBuffers[sampleNdx].getPixel(x, y);
			const tcu::RGBA		highColor	= m_iterationSampleBuffers[sampleNdx + (int)sampleCoverage.size()].getPixel(x, y);
			deUint16			low;
			deUint16			high;

			{
				int redBits		= (int)deFloatRound((float)lowColor.getRed() / 255.0f * 31);
				int greenBits	= (int)deFloatRound((float)lowColor.getGreen() / 255.0f * 63);
				int blueBits	= (int)deFloatRound((float)lowColor.getBlue() / 255.0f * 31);

				low = (deUint16)(redBits | (greenBits << 5) | (blueBits << 11));
			}
			{
				int redBits		= (int)deFloatRound((float)highColor.getRed() / 255.0f * 31);
				int greenBits	= (int)deFloatRound((float)highColor.getGreen() / 255.0f * 63);
				int blueBits	= (int)deFloatRound((float)highColor.getBlue() / 255.0f * 31);

				high = (deUint16)(redBits | (greenBits << 5) | (blueBits << 11));
			}

			sampleCoverage[sampleNdx].getAccess().setPixel(tcu::UVec4((((deUint32)high) << 16) | low, 0, 0, 0), x, y);
		}
	}

	// verify masks

	if (m_numRequestedSamples == 0)
	{
		// single sample target, expect mask = 0x01
		const int	printFloodLimit	= 5;
		int			printCount		= 0;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample mask is 0x00000001." << tcu::TestLog::EndMessage;

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			deUint32 mask = sampleCoverage[0].getAccess().getPixelUint(x, y).x();
			if (mask != 0x01)
			{
				allOk = false;

				if (++printCount <= printFloodLimit)
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "Pixel (" << x << ", " << y << "): Invalid mask, got " << tcu::Format::Hex<8>(mask) << ", expected " << tcu::Format::Hex<8>(0x01) << "\n"
						<< tcu::TestLog::EndMessage;
				}
			}
		}

		if (!allOk && printCount > printFloodLimit)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "...\n"
				<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
				<< tcu::TestLog::EndMessage;
		}
	}
	else
	{
		// check uniqueness
		{
			bool		uniquenessOk	= true;
			int			printCount		= 0;
			const int	printFloodLimit	= 5;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying invocation sample masks do not share bits." << tcu::TestLog::EndMessage;

			for (int y = 0; y < height; ++y)
			for (int x = 0; x < width; ++x)
			{
				bool maskBitsNotUnique = false;

				for (int sampleNdxA = 0;            sampleNdxA < m_numTargetSamples && (!maskBitsNotUnique || printCount < printFloodLimit); ++sampleNdxA)
				for (int sampleNdxB = sampleNdxA+1; sampleNdxB < m_numTargetSamples && (!maskBitsNotUnique || printCount < printFloodLimit); ++sampleNdxB)
				{
					const deUint32 maskA = sampleCoverage[sampleNdxA].getAccess().getPixelUint(x, y).x();
					const deUint32 maskB = sampleCoverage[sampleNdxB].getAccess().getPixelUint(x, y).x();

					// equal mask == emitted by the same invocation
					if (maskA != maskB)
					{
						// shares samples?
						if (maskA & maskB)
						{
							maskBitsNotUnique = true;
							uniquenessOk = false;

							if (++printCount <= printFloodLimit)
							{
								m_testCtx.getLog()
									<< tcu::TestLog::Message
									<< "Pixel (" << x << ", " << y << "):\n"
									<< "\tSamples " << sampleNdxA << " and " << sampleNdxB << " share mask bits\n"
									<< "\tMask" << sampleNdxA << " = " << tcu::Format::Hex<8>(maskA) << "\n"
									<< "\tMask" << sampleNdxB << " = " << tcu::Format::Hex<8>(maskB) << "\n"
									<< tcu::TestLog::EndMessage;
							}
						}
					}
				}
			}

			if (!uniquenessOk)
			{
				allOk = false;

				if (printCount > printFloodLimit)
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "...\n"
						<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
						<< tcu::TestLog::EndMessage;
			}
		}

		// check number of sample mask bit groups is valid ( == number of invocations )
		{
			const deUint32			minNumInvocations	= (deUint32)de::max(1, (m_numTargetSamples+1)/2);
			bool					countOk				= true;
			int						printCount			= 0;
			const int				printFloodLimit		= 5;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying cardinality of separate sample mask bit sets. Expecting equal to the number of invocations, (greater or equal to " << minNumInvocations << ")" << tcu::TestLog::EndMessage;

			for (int y = 0; y < height; ++y)
			for (int x = 0; x < width; ++x)
			{
				std::set<deUint32> masks;

				for (int maskNdx = 0; maskNdx < m_numTargetSamples; ++maskNdx)
				{
					const deUint32 mask = sampleCoverage[maskNdx].getAccess().getPixelUint(x, y).x();
					masks.insert(mask);
				}

				if ((int)masks.size() < (int)minNumInvocations)
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Pixel invocations had only " << (int)masks.size() << " separate mask sets. Expected " << minNumInvocations << " or more. Found masks:"
							<< tcu::TestLog::EndMessage;

						for (std::set<deUint32>::iterator it = masks.begin(); it != masks.end(); ++it)
							m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "\tMask: " << tcu::Format::Hex<8>(*it) << "\n"
							<< tcu::TestLog::EndMessage;
					}

					countOk = false;
				}
			}

			if (!countOk)
			{
				allOk = false;

				if (printCount > printFloodLimit)
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "...\n"
						<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
						<< tcu::TestLog::EndMessage;
			}
		}
	}

	if (!allOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
}